

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O1

bool cmakeCheckStampFile(char *stampName,bool verbose)

{
  long *oldname;
  bool bVar1;
  size_t sVar2;
  ostream *poVar3;
  cmFileTimeComparison ftc;
  string dep;
  string stampDepends;
  string stampTempString;
  int result;
  ostringstream stampTempStream;
  ifstream fin;
  undefined1 auStack_628 [15];
  allocator local_619;
  cmFileTimeComparison local_618;
  string local_610;
  long *local_5f0;
  long local_5e8;
  long local_5e0 [2];
  long *local_5d0;
  long local_5c0 [2];
  undefined1 local_5b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5a0 [14];
  ios_base local_4b8 [264];
  undefined1 local_3b0 [376];
  long local_238 [4];
  byte abStack_218 [488];
  
  std::__cxx11::string::string((string *)&local_5f0,stampName,(allocator *)local_238);
  std::__cxx11::string::append((char *)&local_5f0);
  std::ifstream::ifstream(local_238,(char *)local_5f0,_S_in);
  if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 5) == 0) {
    cmFileTimeComparison::cmFileTimeComparison(&local_618);
    local_610._M_string_length = 0;
    local_610.field_2._M_local_buf[0] = '\0';
    local_610._M_dataplus._M_p = (pointer)&local_610.field_2;
    do {
      do {
        bVar1 = cmsys::SystemTools::GetLineFromStream
                          ((istream *)local_238,&local_610,(bool *)0x0,-1);
        if (!bVar1) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b0);
          if (stampName == (char *)0x0) {
            std::ios::clear((int)(auStack_628 + (long)*(_func_int **)(local_3b0._0_8_ + -0x18)) +
                            0x278);
          }
          else {
            sVar2 = strlen(stampName);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3b0,stampName,sVar2)
            ;
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3b0,".tmp",4);
          cmSystemTools::RandomSeed();
          std::ostream::_M_insert<unsigned_long>((ulong)local_3b0);
          std::__cxx11::stringbuf::str();
          oldname = local_5d0;
          std::ofstream::ofstream(local_5b0,(char *)local_5d0,_S_out);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_5b0,"# CMake generation timestamp file for this directory.\n",
                     0x36);
          local_5b0._0_8_ = _VTT;
          *(undefined8 *)(local_5b0 + (&_VTT->_M_allocated_capacity)[-3]) = _vtable;
          std::filebuf::~filebuf((filebuf *)(local_5b0 + 8));
          std::ios_base::~ios_base(local_4b8);
          bVar1 = cmSystemTools::RenameFile((char *)oldname,stampName);
          if (bVar1) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"CMake does not need to re-run because ",0x26);
            if (stampName == (char *)0x0) {
              std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x6a46b0);
            }
            else {
              sVar2 = strlen(stampName);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,stampName,sVar2);
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout," is up-to-date.\n",0x10);
          }
          else {
            std::__cxx11::string::string((string *)local_5b0,(char *)oldname,&local_619);
            cmsys::SystemTools::RemoveFile((string *)local_5b0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_5b0._0_8_ != local_5a0) {
              operator_delete((void *)local_5b0._0_8_,local_5a0[0]._M_allocated_capacity + 1);
            }
            cmSystemTools::Error("Cannot restore timestamp ",stampName,(char *)0x0,(char *)0x0);
          }
          if (local_5d0 != local_5c0) {
            operator_delete(local_5d0,local_5c0[0] + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3b0);
          std::ios_base::~ios_base((ios_base *)(local_3b0 + 0x70));
          goto LAB_002b85ff;
        }
      } while ((local_610._M_string_length == 0) || (*local_610._M_dataplus._M_p == '#'));
      bVar1 = cmFileTimeComparison::FileTimeCompare
                        (&local_618,(char *)local_5f0,local_610._M_dataplus._M_p,(int *)local_5b0);
    } while (bVar1 && -1 < (int)local_5b0._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"CMake is re-running because ",0x1c);
    if (stampName == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x6a46b0);
    }
    else {
      sVar2 = strlen(stampName);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,stampName,sVar2);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout," is out-of-date.\n",0x11);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  the file \'",0xc);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_610._M_dataplus._M_p,local_610._M_string_length)
    ;
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\'\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"  is newer than \'",0x11);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)local_5f0,local_5e8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\'\n",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  result=\'",10);
    poVar3 = (ostream *)std::ostream::operator<<(&std::cout,local_5b0._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\'\n",2);
    bVar1 = false;
LAB_002b85ff:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_610._M_dataplus._M_p != &local_610.field_2) {
      operator_delete(local_610._M_dataplus._M_p,
                      CONCAT71(local_610.field_2._M_allocated_capacity._1_7_,
                               local_610.field_2._M_local_buf[0]) + 1);
    }
    cmFileTimeComparison::~cmFileTimeComparison(&local_618);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"CMake is re-running because ",0x1c);
    if (stampName == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x6a46b0);
    }
    else {
      sVar2 = strlen(stampName);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,stampName,sVar2);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout," dependency file is missing.\n",0x1d);
    bVar1 = false;
  }
  std::ifstream::~ifstream(local_238);
  if (local_5f0 != local_5e0) {
    operator_delete(local_5f0,local_5e0[0] + 1);
  }
  return bVar1;
}

Assistant:

static bool cmakeCheckStampFile(const char* stampName, bool verbose)
{
  // The stamp file does not exist.  Use the stamp dependencies to
  // determine whether it is really out of date.  This works in
  // conjunction with cmLocalVisualStudio7Generator to avoid
  // repeatedly re-running CMake when the user rebuilds the entire
  // solution.
  std::string stampDepends = stampName;
  stampDepends += ".depend";
#if defined(_WIN32) || defined(__CYGWIN__)
  cmsys::ifstream fin(stampDepends.c_str(), std::ios::in | std::ios::binary);
#else
  cmsys::ifstream fin(stampDepends.c_str());
#endif
  if (!fin) {
    // The stamp dependencies file cannot be read.  Just assume the
    // build system is really out of date.
    std::cout << "CMake is re-running because " << stampName
              << " dependency file is missing.\n";
    return false;
  }

  // Compare the stamp dependencies against the dependency file itself.
  cmFileTimeComparison ftc;
  std::string dep;
  while (cmSystemTools::GetLineFromStream(fin, dep)) {
    int result;
    if (!dep.empty() && dep[0] != '#' &&
        (!ftc.FileTimeCompare(stampDepends.c_str(), dep.c_str(), &result) ||
         result < 0)) {
      // The stamp depends file is older than this dependency.  The
      // build system is really out of date.
      std::cout << "CMake is re-running because " << stampName
                << " is out-of-date.\n";
      std::cout << "  the file '" << dep << "'\n";
      std::cout << "  is newer than '" << stampDepends << "'\n";
      std::cout << "  result='" << result << "'\n";
      return false;
    }
  }

  // The build system is up to date.  The stamp file has been removed
  // by the VS IDE due to a "rebuild" request.  Restore it atomically.
  std::ostringstream stampTempStream;
  stampTempStream << stampName << ".tmp" << cmSystemTools::RandomSeed();
  std::string stampTempString = stampTempStream.str();
  const char* stampTemp = stampTempString.c_str();
  {
    // TODO: Teach cmGeneratedFileStream to use a random temp file (with
    // multiple tries in unlikely case of conflict) and use that here.
    cmsys::ofstream stamp(stampTemp);
    stamp << "# CMake generation timestamp file for this directory.\n";
  }
  if (cmSystemTools::RenameFile(stampTemp, stampName)) {
    if (verbose) {
      // Notify the user why CMake is not re-running.  It is safe to
      // just print to stdout here because this code is only reachable
      // through an undocumented flag used by the VS generator.
      std::cout << "CMake does not need to re-run because " << stampName
                << " is up-to-date.\n";
    }
    return true;
  }
  cmSystemTools::RemoveFile(stampTemp);
  cmSystemTools::Error("Cannot restore timestamp ", stampName);
  return false;
}